

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void wasm::debug::copyDebugInfo
               (Expression *origin,Expression *copy,Function *originFunc,Function *copyFunc)

{
  iterator iVar1;
  mapped_type *pmVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auStack_228 [8];
  Lister copyList;
  Lister originList;
  Expression *origin_local;
  Expression *copy_local;
  DebugLocation location;
  
  copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.replacep = (Expression **)0x0;
  originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed._M_elems[9].currp
       = (Expression **)0x0;
  originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currFunction = (Function *)0x0
  ;
  originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule = (Module *)0x0;
  originList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  originList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  originList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)origin;
  origin_local = copy;
  Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::walk
            ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)
             &copyList.list.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Expression **)
             &originList.list.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  auStack_228 = (undefined1  [8])0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.replacep = (Expression **)0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed._M_elems[9].currp
       = (Expression **)0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currFunction = (Function *)0x0
  ;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule = (Module *)0x0;
  copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::walk
            ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)auStack_228,
             &origin_local);
  if ((long)originList.list.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start -
      (long)originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
            super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule !=
      (long)copyList.list.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start -
      (long)copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
            super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule) {
    __assert_fail("originList.list.size() == copyList.list.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/debug.h"
                  ,0x2b,
                  "void wasm::debug::copyDebugInfo(Expression *, Expression *, Function *, Function *)"
                 );
  }
  if ((Module *)
      originList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      iVar1 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(originFunc->debugLocations)._M_h,
                     (key_type *)
                     (&((originList.
                         super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                         super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                        currModule)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar4));
      if (iVar1.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
          ._M_cur != (__node_type *)0x0) {
        location.fileIndex =
             *(BinaryLocation *)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                     ._M_cur + 0x18);
        copy_local = *(Expression **)
                      ((long)iVar1.
                             super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                             ._M_cur + 0x10);
        pmVar2 = std::__detail::
                 _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&copyFunc->debugLocations,
                              (key_type *)
                              (&((copyList.
                                  super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                                  .
                                  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                                 .currModule)->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar4));
        pmVar2->columnNumber = location.fileIndex;
        *(Expression **)pmVar2 = copy_local;
      }
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < (ulong)((long)originList.list.
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start -
                             (long)originList.
                                   super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                                   .
                                   super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                                   .currModule >> 3));
  }
  if (copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule !=
      (Module *)0x0) {
    operator_delete(copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                    .super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule,
                    (long)copyList.list.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)copyList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          currModule);
  }
  if (copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed._M_elems[9].
      currp != (Expression **)0x0) {
    operator_delete(copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                    .super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed
                    ._M_elems[9].currp,
                    (long)copyList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                          flexible.
                          super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)copyList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                          fixed._M_elems[9].currp);
  }
  if (originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule !=
      (Module *)0x0) {
    operator_delete(originList.
                    super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                    super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule,
                    (long)originList.list.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)originList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          currModule);
  }
  if (originList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed._M_elems[9].
      currp != (Expression **)0x0) {
    operator_delete(originList.
                    super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                    super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed.
                    _M_elems[9].currp,
                    (long)originList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                          flexible.
                          super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)originList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                          fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

inline void copyDebugInfo(Expression* origin,
                          Expression* copy,
                          Function* originFunc,
                          Function* copyFunc) {
  struct Lister : public PostWalker<Lister, UnifiedExpressionVisitor<Lister>> {
    std::vector<Expression*> list;
    void visitExpression(Expression* curr) { list.push_back(curr); }
  };

  Lister originList;
  originList.walk(origin);
  Lister copyList;
  copyList.walk(copy);

  auto& originDebug = originFunc->debugLocations;
  auto& copyDebug = copyFunc->debugLocations;

  assert(originList.list.size() == copyList.list.size());
  for (Index i = 0; i < originList.list.size(); i++) {
    auto iter = originDebug.find(originList.list[i]);
    if (iter != originDebug.end()) {
      auto location = iter->second;
      copyDebug[copyList.list[i]] = location;
    }
  }
}